

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O0

ES5ArrayTypeHandler * __thiscall
Js::NullTypeHandlerBase::ConvertToES5ArrayType(NullTypeHandlerBase *this,DynamicObject *instance)

{
  ES5ArrayTypeHandlerBase<unsigned_short> *pEVar1;
  ScriptContext *pSVar2;
  ES5ArrayTypeHandler *newTypeHandler;
  DynamicObject *instance_local;
  NullTypeHandlerBase *this_local;
  
  pEVar1 = ConvertToTypeHandler<Js::ES5ArrayTypeHandlerBase<unsigned_short>>(this,instance);
  pSVar2 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pSVar2->convertNullToDictionaryCount = pSVar2->convertNullToDictionaryCount + 1;
  return pEVar1;
}

Assistant:

ES5ArrayTypeHandler* NullTypeHandlerBase::ConvertToES5ArrayType(DynamicObject * instance)
    {
        ES5ArrayTypeHandler* newTypeHandler = ConvertToTypeHandler<ES5ArrayTypeHandler>(instance);

#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertNullToDictionaryCount++;
#endif
        return newTypeHandler;
    }